

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageDashedLine(gdImagePtr im,int x1,int y1,int x2,int y2,int color)

{
  uint uVar1;
  gdImagePtr pgVar2;
  uint wid;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000084;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  double dVar9;
  int wid_00;
  int on;
  int dashStep;
  undefined8 local_58;
  uint local_4c;
  gdImagePtr local_48;
  double local_40;
  ulong local_38;
  
  dashStep = 0;
  on = 1;
  uVar6 = x2 - x1;
  uVar1 = -uVar6;
  if (0 < (int)uVar6) {
    uVar1 = uVar6;
  }
  local_4c = y2 - y1;
  uVar8 = -local_4c;
  if (0 < (int)local_4c) {
    uVar8 = local_4c;
  }
  local_40 = (double)im->thick;
  local_48 = im;
  local_58._0_4_ = y2;
  local_58._4_4_ = in_register_00000084;
  dVar9 = atan2((double)(int)uVar8,(double)(int)uVar1);
  dVar9 = sin(dVar9);
  wid = 1;
  if (dVar9 != 0.0) {
    wid = (int)(local_40 / dVar9);
  }
  if (NAN(dVar9)) {
    wid = (int)(local_40 / dVar9);
  }
  local_38 = (ulong)wid;
  if (uVar8 < uVar1 || uVar8 - uVar1 == 0) {
    if (x2 < x1) {
      iVar3 = -1;
      y1 = (int)local_58;
      iVar4 = x2;
    }
    else {
      iVar3 = 1;
      iVar4 = x1;
      x1 = x2;
    }
    local_40 = (double)CONCAT44(local_40._4_4_,uVar8 * 2);
    iVar7 = uVar8 * 2 - uVar1;
    iVar5 = (uVar8 - uVar1) * 2;
    dashedSet(local_48,iVar4,y1,color,&on,&dashStep,wid,1);
    pgVar2 = local_48;
    wid_00 = (int)local_38;
    if ((int)(iVar3 * local_4c) < 1) {
      if (iVar4 < x1) {
        do {
          iVar4 = iVar4 + 1;
          iVar3 = local_40._0_4_;
          if (-1 < iVar7) {
            iVar3 = iVar5;
          }
          y1 = y1 - (uint)(-1 < iVar7);
          iVar7 = iVar7 + iVar3;
          dashedSet(pgVar2,iVar4,y1,color,&on,&dashStep,wid_00,1);
        } while (iVar4 != x1);
      }
    }
    else if (iVar4 < x1) {
      local_58 = CONCAT44(local_58._4_4_,iVar5);
      do {
        iVar4 = iVar4 + 1;
        iVar3 = local_40._0_4_;
        if (-1 < iVar7) {
          iVar3 = iVar5;
        }
        y1 = y1 + (uint)(-1 < iVar7);
        iVar7 = iVar7 + iVar3;
        dashedSet(pgVar2,iVar4,y1,color,&on,&dashStep,wid_00,1);
        iVar5 = (int)local_58;
      } while (iVar4 != x1);
    }
  }
  else {
    if ((int)local_58 < y1) {
      local_58._4_4_ = 0;
      local_4c = -1;
      iVar4 = (int)local_58;
      local_58._0_4_ = y1;
    }
    else {
      local_4c = 1;
      x2 = x1;
      iVar4 = y1;
    }
    local_40 = (double)CONCAT44(local_40._4_4_,uVar1 * 2);
    iVar5 = uVar1 * 2 - uVar8;
    iVar3 = (uVar1 - uVar8) * 2;
    dashedSet(local_48,x2,iVar4,color,&on,&dashStep,wid,0);
    pgVar2 = local_48;
    if ((int)(local_4c * uVar6) < 1) {
      if (iVar4 < (int)local_58) {
        local_58 = (ulong)(uint)-(int)local_58;
        do {
          iVar4 = iVar4 + 1;
          iVar7 = local_40._0_4_;
          if (-1 < iVar5) {
            iVar7 = iVar3;
          }
          x2 = x2 - (uint)(-1 < iVar5);
          iVar5 = iVar5 + iVar7;
          dashedSet(pgVar2,x2,iVar4,color,&on,&dashStep,wid,0);
        } while ((int)local_58 + iVar4 != 0);
      }
    }
    else if (iVar4 < (int)local_58) {
      local_58 = (ulong)(uint)-(int)local_58;
      do {
        iVar4 = iVar4 + 1;
        iVar7 = local_40._0_4_;
        if (-1 < iVar5) {
          iVar7 = iVar3;
        }
        x2 = x2 + (uint)(-1 < iVar5);
        iVar5 = iVar5 + iVar7;
        dashedSet(pgVar2,x2,iVar4,color,&on,&dashStep,wid,0);
      } while ((int)local_58 + iVar4 != 0);
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageDashedLine (gdImagePtr im, int x1, int y1, int x2, int y2, int color)
{
	int dx, dy, incr1, incr2, d, x, y, xend, yend, xdirflag, ydirflag;
	int dashStep = 0;
	int on = 1;
	int wid;
	int vert;
	int thick = im->thick;

	dx = abs (x2 - x1);
	dy = abs (y2 - y1);
	if (dy <= dx) {
		/* More-or-less horizontal. use wid for vertical stroke */
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
		   TBB: but watch out for /0! */
		double as = sin (atan2 (dy, dx));
		if (as != 0) {
			wid = thick / as;
		} else {
			wid = 1;
		}
		vert = 1;

		d = 2 * dy - dx;
		incr1 = 2 * dy;
		incr2 = 2 * (dy - dx);
		if (x1 > x2) {
			x = x2;
			y = y2;
			ydirflag = (-1);
			xend = x1;
		} else {
			x = x1;
			y = y1;
			ydirflag = 1;
			xend = x2;
		}
		dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
		if (((y2 - y1) * ydirflag) > 0) {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y++;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		} else {
			while (x < xend) {
				x++;
				if (d < 0) {
					d += incr1;
				} else {
					y--;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		}
	} else {
		/* 2.0.12: Michael Schwartz: divide rather than multiply;
		   TBB: but watch out for /0! */
		double as = sin (atan2 (dy, dx));
		if (as != 0) {
			wid = thick / as;
		} else {
			wid = 1;
		}
		vert = 0;

		d = 2 * dx - dy;
		incr1 = 2 * dx;
		incr2 = 2 * (dx - dy);
		if (y1 > y2) {
			y = y2;
			x = x2;
			yend = y1;
			xdirflag = (-1);
		} else {
			y = y1;
			x = x1;
			yend = y2;
			xdirflag = 1;
		}
		dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
		if (((x2 - x1) * xdirflag) > 0) {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x++;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		} else {
			while (y < yend) {
				y++;
				if (d < 0) {
					d += incr1;
				} else {
					x--;
					d += incr2;
				}
				dashedSet (im, x, y, color, &on, &dashStep, wid, vert);
			}
		}
	}
}